

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yy_2_funcdef(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_children1(&G->data,PVIP_NODE_OUR,G->val[-5]);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_2_funcdef(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define b G->val[-1]
#define e G->val[-2]
#define p G->val[-3]
#define i G->val[-4]
#define f G->val[-5]
  yyprintf((stderr, "do yy_2_funcdef"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_OUR, f); }\n"));
  yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_OUR, f); ;
#undef b
#undef e
#undef p
#undef i
#undef f
}